

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  DiskInterface *this_00;
  RelPathEnv *this_01;
  Metrics *this_02;
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference ppNVar4;
  string *psVar5;
  ulong uVar6;
  pointer pCVar7;
  Metric *local_1b8;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  string content;
  string local_c8;
  undefined1 local_a8 [8];
  string rspfile;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_80;
  iterator o;
  undefined1 local_70 [8];
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  Edge *edge_local;
  Builder *this_local;
  
  local_28 = err;
  err_local = (string *)edge;
  edge_local = (Edge *)this;
  if ((StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar2 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric),
     this_02 = g_metrics, iVar2 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_1b8 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"StartEdge",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_1b8 = Metrics::NewMetric(this_02,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    StartEdge::metrics_h_metric = local_1b8;
    __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)local_70,StartEdge::metrics_h_metric);
  bVar1 = Edge::is_phony((Edge *)err_local);
  if (bVar1) {
    this_local._7_1_ = 1;
    o._M_current._4_4_ = 1;
    goto LAB_001c7a92;
  }
  BuildStatus::BuildEdgeStarted(this->status_,(Edge *)err_local);
  local_80._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                          ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local[1]._M_string_length
                          );
  while( true ) {
    rspfile.field_2._8_8_ =
         std::vector<Node_*,_std::allocator<Node_*>_>::end
                   ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local[1]._M_string_length);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       ((long)&rspfile.field_2 + 8));
    if (!bVar1) break;
    this_00 = this->disk_interface_;
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_80);
    psVar5 = Node::path_abi_cxx11_(*ppNVar4);
    bVar1 = DiskInterface::MakeDirs(this_00,psVar5);
    if (!bVar1) {
      this_local._7_1_ = 0;
      o._M_current._4_4_ = 1;
      goto LAB_001c7a92;
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_80);
  }
  Edge::GetUnescapedRspfile_abi_cxx11_((string *)local_a8,(Edge *)err_local);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    this_01 = (RelPathEnv *)err_local[2]._M_string_length;
    std::__cxx11::string::string((string *)(content.field_2._M_local_buf + 8),(string *)local_a8);
    RelPathEnv::ApplyChdir(&local_c8,this_01,(string *)((long)&content.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
    psVar5 = err_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"rspfile_content",&local_129);
    Edge::GetBinding((string *)local_108,(Edge *)psVar5,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    uVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[7])
                      (this->disk_interface_,local_a8,local_108);
    o._M_current._4_1_ = (uVar3 & 1) == 0;
    if (o._M_current._4_1_) {
      this_local._7_1_ = 0;
    }
    o._M_current._5_3_ = 0;
    std::__cxx11::string::~string((string *)local_108);
    if (o._M_current._4_4_ == 0) goto LAB_001c7964;
  }
  else {
LAB_001c7964:
    pCVar7 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    uVar3 = (*pCVar7->_vptr_CommandRunner[3])(pCVar7,err_local);
    psVar5 = local_28;
    if ((uVar3 & 1) == 0) {
      Edge::EvaluateCommand_abi_cxx11_(&local_190,(Edge *)err_local,false);
      std::operator+(&local_170,"command \'",&local_190);
      std::operator+(&local_150,&local_170,"\' failed.");
      std::__cxx11::string::assign((string *)psVar5);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      this_local._7_1_ = 0;
      o._M_current._4_4_ = 1;
    }
    else {
      this_local._7_1_ = 1;
      o._M_current._4_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_a8);
LAB_001c7a92:
  ScopedMetric::~ScopedMetric((ScopedMetric *)local_70);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  status_->BuildEdgeStarted(edge);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}